

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O2

void __thiscall
QtMWidgets::Section::fillValues
          (Section *this,QDateTime *current,QDateTime *min,QDateTime *max,bool updateIndex)

{
  QVector<QString> *this_00;
  Type TVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int i_1;
  undefined3 in_register_00000081;
  int i;
  int i_5;
  QLatin1String latin1;
  QLatin1String latin1_00;
  QString v;
  QDate date;
  QLocale local_50 [8];
  QArrayDataPointer<char16_t> local_48;
  
  this_00 = &this->values;
  QList<QString>::clear(this_00);
  if (CONCAT31(in_register_00000081,updateIndex) != 0) {
    this->currentIndex = -1;
  }
  TVar1 = this->type;
  switch(TVar1) {
  case AmPmSection:
    latin1.m_data = "AM";
    latin1.m_size = 2;
    QString::QString(&v,latin1);
    QList<QString>::emplaceBack<QString>(this_00,&v);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
    latin1_00.m_data = "PM";
    latin1_00.m_size = 2;
    QString::QString(&v,latin1_00);
    QList<QString>::emplaceBack<QString>(this_00,&v);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
    uVar5 = QDateTime::time();
    v.d.d = (Data *)CONCAT44(v.d.d._4_4_,uVar5);
    iVar2 = QTime::hour();
    if (iVar2 < 0xc) {
      this->currentIndex = 0;
    }
    else {
      this->currentIndex = 1;
    }
    break;
  case SecondSection:
    uVar5 = QDateTime::time();
    v.d.d = (Data *)CONCAT44(v.d.d._4_4_,uVar5);
    iVar2 = QTime::second();
    for (iVar3 = 0; iVar3 != 0x3c; iVar3 = iVar3 + 1) {
      v.d.d = (Data *)0x0;
      v.d.ptr = (char16_t *)0x0;
      v.d.size = 0;
      makeSectionValue(&v,iVar3,this->zeroesAdded);
      if (iVar2 == iVar3) {
        this->currentIndex = (int)(this->values).d.size;
      }
      QList<QString>::emplaceBack<QString_const&>(this_00,&v);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
    }
    break;
  case SecondSection|AmPmSection:
  case MinuteSection|AmPmSection:
  case MinuteSection|SecondSection:
  case MinuteSection|SecondSection|AmPmSection:
    break;
  case MinuteSection:
    uVar5 = QDateTime::time();
    v.d.d = (Data *)CONCAT44(v.d.d._4_4_,uVar5);
    iVar2 = QTime::minute();
    for (iVar3 = 0; iVar3 != 0x3c; iVar3 = iVar3 + 1) {
      v.d.d = (Data *)0x0;
      v.d.ptr = (char16_t *)0x0;
      v.d.size = 0;
      makeSectionValue(&v,iVar3,this->zeroesAdded);
      if (iVar2 == iVar3) {
        this->currentIndex = (int)(this->values).d.size;
      }
      QList<QString>::emplaceBack<QString_const&>(this_00,&v);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
    }
    break;
  case Hour12Section:
    uVar5 = QDateTime::time();
    v.d.d = (Data *)CONCAT44(v.d.d._4_4_,uVar5);
    iVar3 = QTime::hour();
    iVar2 = iVar3 + -0xc;
    if (iVar3 < 0xd) {
      iVar2 = iVar3;
    }
    iVar4 = 0xc;
    if (iVar3 != 0) {
      iVar4 = iVar2;
    }
    for (iVar2 = 1; iVar2 != 0xd; iVar2 = iVar2 + 1) {
      v.d.d = (Data *)0x0;
      v.d.ptr = (char16_t *)0x0;
      v.d.size = 0;
      makeSectionValue(&v,iVar2,this->zeroesAdded);
      if (iVar4 == iVar2) {
        this->currentIndex = (int)(this->values).d.size;
      }
      QList<QString>::emplaceBack<QString_const&>(this_00,&v);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
    }
    break;
  default:
    if (TVar1 == Hour24Section) {
      uVar5 = QDateTime::time();
      v.d.d = (Data *)CONCAT44(v.d.d._4_4_,uVar5);
      iVar2 = QTime::hour();
      for (iVar3 = 0; iVar3 != 0x18; iVar3 = iVar3 + 1) {
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar3,this->zeroesAdded);
        if (iVar2 == iVar3) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
      }
    }
    else if (TVar1 == DaySection) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::day();
      iVar2 = 1;
      while( true ) {
        v.d.d = (Data *)QDateTime::date();
        iVar4 = QDate::daysInMonth();
        if (iVar4 < iVar2) break;
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if ((updateIndex) && (iVar3 == iVar2)) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
        iVar2 = iVar2 + 1;
      }
    }
    else if (TVar1 == DaySectionShort) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::day();
      v.d.d = (Data *)QDateTime::date();
      iVar4 = QDate::year();
      local_48.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      iVar2 = 1;
      QDate::QDate(&date,iVar4,iVar6,1);
      while( true ) {
        v.d.d = (Data *)QDateTime::date();
        iVar4 = QDate::daysInMonth();
        if (iVar4 < iVar2) break;
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if ((updateIndex) && (iVar3 == iVar2)) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QString::prepend(&v,(QChar)0x20);
        QLocale::system();
        QDate::dayOfWeek();
        QLocale::dayName((int)&local_48,(FormatType)local_50);
        QString::prepend(&v,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QLocale::~QLocale(local_50);
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        date.jd = QDate::addDays((longlong)&date);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
        iVar2 = iVar2 + 1;
      }
    }
    else if (TVar1 == DaySectionLong) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::day();
      v.d.d = (Data *)QDateTime::date();
      iVar4 = QDate::year();
      local_48.d = (Data *)QDateTime::date();
      iVar6 = QDate::month();
      iVar2 = 1;
      QDate::QDate(&date,iVar4,iVar6,1);
      while( true ) {
        v.d.d = (Data *)QDateTime::date();
        iVar4 = QDate::daysInMonth();
        if (iVar4 < iVar2) break;
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if ((updateIndex) && (iVar3 == iVar2)) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QString::prepend(&v,(QChar)0x20);
        QLocale::system();
        QDate::dayOfWeek();
        QLocale::dayName((int)&local_48,(FormatType)local_50);
        QString::prepend(&v,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QLocale::~QLocale(local_50);
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        date.jd = QDate::addDays((longlong)&date);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
        iVar2 = iVar2 + 1;
      }
    }
    else if (TVar1 == MonthSection) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::month();
      for (iVar2 = 1; iVar2 != 0xd; iVar2 = iVar2 + 1) {
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if (iVar3 == iVar2) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
      }
    }
    else if (TVar1 == MonthSectionShort) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::month();
      for (iVar2 = 1; iVar2 != 0xd; iVar2 = iVar2 + 1) {
        if (iVar3 == iVar2) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QLocale::system();
        QLocale::monthName((int)&v,(FormatType)&local_48);
        QList<QString>::emplaceBack<QString>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
        QLocale::~QLocale((QLocale *)&local_48);
      }
    }
    else if (TVar1 == MonthSectionLong) {
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::month();
      for (iVar2 = 1; iVar2 != 0xd; iVar2 = iVar2 + 1) {
        if (iVar3 == iVar2) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QLocale::system();
        QLocale::monthName((int)&v,(FormatType)&local_48);
        QList<QString>::emplaceBack<QString>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
        QLocale::~QLocale((QLocale *)&local_48);
      }
    }
    else if (TVar1 == YearSection) {
      v.d.d = (Data *)QDateTime::date();
      iVar2 = QDate::year();
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::year();
      v.d.d = (Data *)QDateTime::date();
      iVar4 = QDate::year();
      for (; iVar2 <= iVar3; iVar2 = iVar2 + 1) {
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if (iVar4 == iVar2) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QList<QString>::emplaceBack<QString_const&>(this_00,&v);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
      }
    }
    else if (TVar1 == YearSection2Digits) {
      v.d.d = (Data *)QDateTime::date();
      iVar2 = QDate::year();
      v.d.d = (Data *)QDateTime::date();
      iVar3 = QDate::year();
      v.d.d = (Data *)QDateTime::date();
      iVar4 = QDate::year();
      for (; iVar2 <= iVar3; iVar2 = iVar2 + 1) {
        v.d.d = (Data *)0x0;
        v.d.ptr = (char16_t *)0x0;
        v.d.size = 0;
        makeSectionValue(&v,iVar2,this->zeroesAdded);
        if (iVar4 == iVar2) {
          this->currentIndex = (int)(this->values).d.size;
        }
        QString::right((longlong)&local_48);
        QList<QString>::emplaceBack<QString>(this_00,(QString *)&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&v.d);
      }
    }
  }
  return;
}

Assistant:

void
Section::fillValues( const QDateTime & current,
	const QDateTime & min, const QDateTime & max,
	bool updateIndex )
{
	values.clear();

	if( updateIndex )
		currentIndex = -1;

	switch( type )
	{
		case AmPmSection :
		{
			values.append( QLatin1String( "AM" ) );
			values.append( QLatin1String( "PM" ) );

			if( current.time().hour() >= 12 )
				currentIndex = 1;
			else
				currentIndex = 0;
		}
		break;

		case SecondSection :
		{
			const int s = current.time().second();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( s == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MinuteSection :
		{
			const int m = current.time().minute();

			for( int i = 0; i < 60; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour12Section :
		{
			int h = 0;
			int currentHour = current.time().hour();

			if( currentHour == 0 )
				h = 12;
			else if( currentHour > 12 )
				h = currentHour - 12;
			else
				h = currentHour;

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case Hour24Section :
		{
			const int h = current.time().hour();

			for( int i = 0; i < 24; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( h == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySection :
		{
			const int d = current.date().day();

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case DaySectionShort :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek(), QLocale::ShortFormat ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case DaySectionLong :
		{
			const int d = current.date().day();

			QDate date( current.date().year(), current.date().month(), 1 );

			for( int i = 1; i <= current.date().daysInMonth(); ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( updateIndex && d == i )
					currentIndex = values.size();

				v.prepend( QLatin1Char( ' ' ) );

				v.prepend( QLocale::system().dayName( date.dayOfWeek() ) );

				values.append( v );

				date = date.addDays( 1 );
			}
		}
		break;

		case MonthSection :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				QString v;

				makeSectionValue( v, i, zeroesAdded );

				if( m == i )
					currentIndex = values.size();

				values.append( v );
			}
		}
		break;

		case MonthSectionShort :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i, QLocale::ShortFormat ) );
			}
		}
		break;

		case MonthSectionLong :
		{
			const int m = current.date().month();

			for( int i = 1; i < 13; ++i )
			{
				if( m == i )
					currentIndex = values.size();

				values.append( QLocale::system().monthName( i ) );
			}
		}
		break;

		case YearSection :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v );

				++start;
			}
		}
		break;

		case YearSection2Digits :
		{
			int start = min.date().year();
			const int finish = max.date().year();
			const int y = current.date().year();

			while( start <= finish )
			{
				QString v;

				makeSectionValue( v, start, zeroesAdded );

				if( start == y )
					currentIndex = values.size();

				values.append( v.right( 2 ) );

				++start;
			}
		}
		break;

		default:
			break;
	}
}